

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec.cpp
# Opt level: O3

void ggml_vec_dot_f16(int n,float *s,size_t bs,ggml_fp16_t *x,size_t bx,ggml_fp16_t *y,size_t by,
                     int nrc)

{
  ushort *puVar1;
  ushort *puVar2;
  undefined1 auVar3 [16];
  float fVar4;
  uint uVar5;
  ggml_fp16_t *pgVar6;
  ulong uVar7;
  ggml_fp16_t *pgVar8;
  long lVar9;
  undefined1 auVar10 [32];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 local_180 [64];
  undefined1 local_140 [64];
  undefined1 local_100 [64];
  undefined1 local_c0 [64];
  
  local_c0 = ZEXT1664(ZEXT816(0) << 0x40);
  uVar5 = n & 0xffffffc0;
  local_100 = local_c0;
  local_140 = local_c0;
  local_180 = local_c0;
  if (0 < (int)uVar5) {
    uVar7 = 0;
    pgVar6 = y;
    pgVar8 = x;
    do {
      lVar9 = 0;
      do {
        auVar11 = vcvtph2ps_avx512f(*(undefined1 (*) [32])((long)pgVar8 + lVar9));
        auVar12 = vcvtph2ps_avx512f(*(undefined1 (*) [32])((long)pgVar6 + lVar9));
        auVar11 = vfmadd213ps_avx512f(auVar12,auVar11,*(undefined1 (*) [64])(local_180 + lVar9 * 2))
        ;
        *(undefined1 (*) [64])(local_180 + lVar9 * 2) = auVar11;
        lVar9 = lVar9 + 0x20;
      } while (lVar9 != 0x80);
      uVar7 = uVar7 + 0x40;
      pgVar6 = pgVar6 + 0x40;
      pgVar8 = pgVar8 + 0x40;
    } while (uVar7 < uVar5);
    auVar11 = vaddps_avx512f(local_180,local_100);
    auVar12 = vaddps_avx512f(local_140,local_c0);
    local_c0 = vaddps_avx512f(auVar11,auVar12);
  }
  auVar10 = vextractf64x4_avx512f(local_c0,1);
  auVar11 = vaddps_avx512f(local_c0,ZEXT3264(auVar10));
  auVar13._0_4_ = auVar11._0_4_ + auVar11._16_4_;
  auVar13._4_4_ = auVar11._4_4_ + auVar11._20_4_;
  auVar13._8_4_ = auVar11._8_4_ + auVar11._24_4_;
  auVar13._12_4_ = auVar11._12_4_ + auVar11._28_4_;
  auVar3 = vshufpd_avx(auVar13,auVar13,1);
  auVar14._0_4_ = auVar13._0_4_ + auVar3._0_4_;
  auVar14._4_4_ = auVar13._4_4_ + auVar3._4_4_;
  auVar14._8_4_ = auVar13._8_4_ + auVar3._8_4_;
  auVar14._12_4_ = auVar13._12_4_ + auVar3._12_4_;
  auVar3 = vhaddps_avx(auVar14,auVar14);
  fVar4 = auVar3._0_4_;
  if (uVar5 != n) {
    lVar9 = (long)(int)uVar5;
    do {
      puVar1 = x + lVar9;
      puVar2 = y + lVar9;
      lVar9 = lVar9 + 1;
      fVar4 = fVar4 + *(float *)(&ggml_table_f32_f16 + (ulong)*puVar1 * 4) *
                      *(float *)(&ggml_table_f32_f16 + (ulong)*puVar2 * 4);
    } while (lVar9 < n);
  }
  *s = fVar4;
  return;
}

Assistant:

void ggml_vec_dot_f16(int n, float * GGML_RESTRICT s, size_t bs, ggml_fp16_t * GGML_RESTRICT x, size_t bx, ggml_fp16_t * GGML_RESTRICT y, size_t by, int nrc) {
    assert(nrc == 1);
    GGML_UNUSED(nrc);
    GGML_UNUSED(bx);
    GGML_UNUSED(by);
    GGML_UNUSED(bs);

    ggml_float sumf = 0.0;

#if defined(GGML_SIMD)
    const int np = (n & ~(GGML_F16_STEP - 1));

    GGML_F16_VEC sum[GGML_F16_ARR] = { GGML_F16_VEC_ZERO };

    GGML_F16_VEC ax[GGML_F16_ARR];
    GGML_F16_VEC ay[GGML_F16_ARR];

    for (int i = 0; i < np; i += GGML_F16_STEP) {
        for (int j = 0; j < GGML_F16_ARR; j++) {
            ax[j] = GGML_F16_VEC_LOAD(x + i + j*GGML_F16_EPR, j);
            ay[j] = GGML_F16_VEC_LOAD(y + i + j*GGML_F16_EPR, j);

            sum[j] = GGML_F16_VEC_FMA(sum[j], ax[j], ay[j]);
        }
    }

    // reduce sum0..sum3 to sum0
    GGML_F16_VEC_REDUCE(sumf, sum);

    // leftovers
    for (int i = np; i < n; ++i) {
        sumf += (ggml_float)(GGML_FP16_TO_FP32(x[i])*GGML_FP16_TO_FP32(y[i]));
    }
#else
    for (int i = 0; i < n; ++i) {
        sumf += (ggml_float)(GGML_FP16_TO_FP32(x[i])*GGML_FP16_TO_FP32(y[i]));
    }
#endif

    *s = sumf;
}